

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,REF_GRID ref_grid)

{
  REF_SHARD pRVar1;
  REF_INT *pRVar2;
  int local_2c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face;
  REF_SHARD ref_shard;
  REF_GRID ref_grid_local;
  REF_SHARD *ref_shard_ptr_local;
  
  pRVar1 = (REF_SHARD)malloc(0x18);
  *ref_shard_ptr = pRVar1;
  if (*ref_shard_ptr == (REF_SHARD)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x23,
           "ref_shard_create","malloc *ref_shard_ptr of REF_SHARD_STRUCT NULL");
    ref_shard_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_shard_ptr;
    pRVar1->grid = ref_grid;
    ref_shard_ptr_local._4_4_ = ref_face_create(&pRVar1->face,pRVar1->grid);
    if (ref_shard_ptr_local._4_4_ == 0) {
      if (pRVar1->face->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x2c,"ref_shard_create","malloc ref_shard->mark of REF_INT negative");
        ref_shard_ptr_local._4_4_ = 1;
      }
      else {
        pRVar2 = (REF_INT *)malloc((long)pRVar1->face->n << 2);
        pRVar1->mark = pRVar2;
        if (pRVar1->mark == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x2c,"ref_shard_create","malloc ref_shard->mark of REF_INT NULL");
          ref_shard_ptr_local._4_4_ = 2;
        }
        else {
          for (local_2c = 0; local_2c < pRVar1->face->n; local_2c = local_2c + 1) {
            pRVar1->mark[local_2c] = 0;
          }
          ref_shard_ptr_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x2a,
             "ref_shard_create",(ulong)ref_shard_ptr_local._4_4_,"create face");
    }
  }
  return ref_shard_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,
                                    REF_GRID ref_grid) {
  REF_SHARD ref_shard;
  REF_INT face;

  ref_malloc(*ref_shard_ptr, 1, REF_SHARD_STRUCT);

  ref_shard = *ref_shard_ptr;

  ref_shard_grid(ref_shard) = ref_grid;

  RSS(ref_face_create(&(ref_shard_face(ref_shard)), ref_shard_grid(ref_shard)),
      "create face");

  ref_malloc(ref_shard->mark, ref_face_n(ref_shard_face(ref_shard)), REF_INT);

  for (face = 0; face < ref_face_n(ref_shard_face(ref_shard)); face++)
    ref_shard_mark(ref_shard, face) = 0;

  return REF_SUCCESS;
}